

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O0

reference __thiscall
OpenMesh::BaseKernel::property<int>(BaseKernel *this,FPropHandleT<int> _ph,FaceHandle _fh)

{
  int _idx;
  PropertyT<int> *this_00;
  reference pvVar1;
  BaseKernel *this_local;
  FaceHandle _fh_local;
  FPropHandleT<int> _ph_local;
  
  this_local._0_4_ = _fh.super_BaseHandle.idx_;
  this_local._4_4_ = (int)_ph.super_BasePropHandleT<int>.super_BaseHandle.idx_;
  this_00 = PropertyContainer::property<int>
                      (&this->fprops_,_ph.super_BasePropHandleT<int>.super_BaseHandle.idx_);
  _idx = BaseHandle::idx((BaseHandle *)&this_local);
  pvVar1 = PropertyT<int>::operator[](this_00,_idx);
  return pvVar1;
}

Assistant:

typename FPropHandleT<T>::reference
  property(FPropHandleT<T> _ph, FaceHandle _fh) {
    return fprops_.property(_ph)[_fh.idx()];
  }